

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnCallRef(SharedValidator *this,Location *loc,Index *function_type_index)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  Index func_index;
  FuncType func_type;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0x14,loc);
  RVar2 = TypeChecker::OnIndexedFuncRef(&this->typechecker_,&func_index);
  EVar3 = Error;
  if ((RVar1.enum_ != Error) && (RVar2.enum_ != Error)) {
    func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Var::Var(&local_78,func_index,loc);
    RVar1 = CheckFuncTypeIndex(this,&local_78,&func_type);
    Var::~Var(&local_78);
    RVar2 = TypeChecker::OnCall(&this->typechecker_,&func_type.params,&func_type.results);
    if (RVar2.enum_ != Error && RVar1.enum_ != Error) {
      *function_type_index = func_index;
    }
    EVar3 = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
    FuncType::~FuncType(&func_type);
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnCallRef(const Location& loc,
                                  Index* function_type_index) {
  Result result = CheckInstr(Opcode::CallRef, loc);
  Index func_index;
  result |= typechecker_.OnIndexedFuncRef(&func_index);
  if (Failed(result)) {
    return result;
  }
  FuncType func_type;
  result |= CheckFuncTypeIndex(Var(func_index, loc), &func_type);
  result |= typechecker_.OnCall(func_type.params, func_type.results);
  if (Succeeded(result)) {
    *function_type_index = func_index;
  }
  return result;
}